

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hexdumper.h
# Opt level: O3

uint64_t Hex::Hexdumper_base::getstep(ostream *os)

{
  uint uVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)os + -0x18);
  uVar1 = __step();
  if (uVar1 < *(uint *)(os + lVar2 + 0xc0)) {
    lVar2 = (long)(int)uVar1 * 0x10 + *(long *)(os + lVar2 + 200);
  }
  else {
    lVar2 = std::ios_base::_M_grow_words((int)(os + lVar2),SUB41(uVar1,0));
  }
  return *(uint64_t *)(lVar2 + 8);
}

Assistant:

static uint64_t getstep(std::ostream& os) { return os.iword(__step()); }